

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTree::
climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
          (QGraphicsSceneBspTree *this,anon_class_8_1_898d2811 *visitor,QRectF *rect,int index)

{
  Node *pNVar1;
  int index_00;
  Type TVar2;
  long lVar3;
  Node *pNVar4;
  long in_FS_OFFSET;
  double dVar5;
  QGraphicsItem *local_40;
  anon_class_8_1_54a39814_for__M_pred local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->nodes).d.size;
  do {
    if (lVar3 == 0) {
LAB_0062153d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
    pNVar4 = (this->nodes).d.ptr;
    pNVar1 = pNVar4 + index;
    index_00 = index * 2 + 1;
    TVar2 = pNVar4[index].type;
    if (TVar2 == Horizontal) {
      if (rect->yp <= (pNVar1->field_0).offset && (pNVar1->field_0).offset != rect->yp) {
        climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (this,visitor,rect,index_00);
        dVar5 = rect->yp + rect->h;
LAB_006214f4:
        if (dVar5 < (pNVar1->field_0).offset) goto LAB_0062153d;
      }
    }
    else {
      if (TVar2 != Vertical) {
        if (TVar2 == Leaf) {
          local_40 = visitor->item;
          local_38.t = (QWindow **)&local_40;
          QtPrivate::
          sequential_erase_if<QList<QGraphicsItem*>,QtPrivate::sequential_erase<QList<QGraphicsItem*>,QGraphicsItem*>(QList<QGraphicsItem*>&,QGraphicsItem*const&)::_lambda(auto:1_const&)_1_>
                    ((this->leaves).d.ptr + (pNVar1->field_0).leafIndex,&local_38);
        }
        goto LAB_0062153d;
      }
      if (rect->xp <= (pNVar1->field_0).offset && (pNVar1->field_0).offset != rect->xp) {
        climbTree<QGraphicsSceneBspTree::removeItem(QGraphicsItem*,QRectF_const&)::__0&>
                  (this,visitor,rect,index_00);
        dVar5 = rect->xp + rect->w;
        goto LAB_006214f4;
      }
    }
    index = index * 2 + 2;
    lVar3 = (this->nodes).d.size;
  } while( true );
}

Assistant:

void QGraphicsSceneBspTree::climbTree(Visitor &&visitor, const QRectF &rect, int index) const
{
    if (nodes.isEmpty())
        return;

    const Node &node = nodes.at(index);
    const int childIndex = firstChildIndex(index);

    switch (node.type) {
    case Node::Leaf: {
        visitor(const_cast<QList<QGraphicsItem*>*>(&leaves[node.leafIndex]));
        break;
    }
    case Node::Vertical:
        if (rect.left() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.right() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
        break;
    case Node::Horizontal:
        if (rect.top() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.bottom() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
    }
}